

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

void show_skill_cmds(CHAR_DATA *ch,int tar)

{
  bool bVar1;
  int in_ESI;
  int col;
  int sn;
  char buf1 [9216];
  char buf [4608];
  int local_3620;
  int local_361c;
  char cVar2;
  undefined7 in_stack_ffffffffffffc9e9;
  char *in_stack_ffffffffffffc9f0;
  char local_1218 [4620];
  int local_c;
  
  cVar2 = '\0';
  local_3620 = 0;
  local_361c = 0;
  local_c = in_ESI;
  while ((local_361c < 800 && (skill_table[local_361c].name != (char *)0x0))) {
    bVar1 = str_cmp(skill_table[local_361c].name,"reserved");
    if (((bVar1) && (skill_table[local_361c].spell_fun != spell_null)) &&
       ((local_c == -1 || (skill_table[local_361c].target == local_c)))) {
      sprintf(local_1218,"%-19.18s",skill_table[local_361c].name);
      strcat(&stack0xffffffffffffc9e8,local_1218);
      local_3620 = local_3620 + 1;
      if (local_3620 % 4 == 0) {
        strcat(&stack0xffffffffffffc9e8,"\n\r");
      }
    }
    local_361c = local_361c + 1;
  }
  if (local_3620 % 4 != 0) {
    strcat(&stack0xffffffffffffc9e8,"\n\r");
  }
  send_to_char(in_stack_ffffffffffffc9f0,(CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,cVar2));
  return;
}

Assistant:

void show_skill_cmds(CHAR_DATA *ch, int tar)
{
	char buf[MAX_STRING_LENGTH];
	char buf1[MAX_STRING_LENGTH * 2];
	int sn;
	int col;

	buf1[0] = '\0';
	col = 0;

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (!skill_table[sn].name)
			break;

		if (!str_cmp(skill_table[sn].name, "reserved") || skill_table[sn].spell_fun == spell_null)
			continue;

		if (tar == -1 || skill_table[sn].target == tar)
		{
			sprintf(buf, "%-19.18s", skill_table[sn].name);
			strcat(buf1, buf);

			if (++col % 4 == 0)
				strcat(buf1, "\n\r");
		}
	}

	if (col % 4 != 0)
		strcat(buf1, "\n\r");

	send_to_char(buf1, ch);
}